

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O1

int mbedtls_aes_setkey_dec(mbedtls_aes_context *ctx,uchar *key,uint keybits)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint32_t *puVar4;
  ulong uVar5;
  uint32_t *puVar6;
  uint32_t *puVar7;
  long lVar8;
  uint32_t *puVar9;
  long lVar10;
  undefined1 local_158 [8];
  mbedtls_aes_context cty;
  
  memset((mbedtls_aes_context *)local_158,0,0x120);
  ctx->rk_offset = 0;
  iVar3 = mbedtls_aes_setkey_enc((mbedtls_aes_context *)local_158,key,keybits);
  if (iVar3 == 0) {
    uVar5 = (ulong)(int)local_158._0_4_;
    ctx->nr = local_158._0_4_;
    puVar7 = (uint32_t *)(local_158 + uVar5 * 0x10 + cty._0_8_ * 4);
    puVar6 = ctx->buf + 4;
    ctx->buf[0] = cty.buf[cty._0_8_ + uVar5 * 4 + -2];
    ctx->buf[1] = cty.buf[cty._0_8_ + uVar5 * 4 + -1];
    ctx->buf[2] = cty.buf[cty._0_8_ + uVar5 * 4];
    ctx->buf[3] = cty.buf[cty._0_8_ + uVar5 * 4 + 1];
    if (1 < (long)uVar5) {
      do {
        puVar9 = puVar6;
        puVar4 = puVar7;
        lVar8 = 0;
        lVar10 = 0;
        do {
          uVar1 = puVar4[lVar10];
          puVar9[lVar10] =
               RT1[FSb[uVar1 >> 8 & 0xff]] ^ RT0[FSb[uVar1 & 0xff]] ^ RT2[FSb[uVar1 >> 0x10 & 0xff]]
               ^ RT3[FSb[uVar1 >> 0x18]];
          lVar10 = lVar10 + 1;
          lVar8 = lVar8 + -4;
        } while ((int)lVar10 != 4);
        iVar2 = (int)uVar5;
        uVar5 = (ulong)(iVar2 - 1);
        puVar7 = (uint32_t *)((long)puVar4 + (-0x20 - lVar8));
        puVar6 = (uint32_t *)((long)puVar9 - lVar8);
      } while (2 < iVar2);
      puVar6 = (uint32_t *)((long)puVar9 - lVar8);
      puVar7 = (uint32_t *)((long)puVar4 + (-0x20 - lVar8));
      cty.buf[0x43] = 0;
    }
    *puVar6 = *puVar7;
    puVar6[1] = puVar7[1];
    puVar6[2] = puVar7[2];
    puVar6[3] = puVar7[3];
  }
  mbedtls_platform_zeroize(local_158,0x120);
  return iVar3;
}

Assistant:

int mbedtls_aes_setkey_dec(mbedtls_aes_context *ctx, const unsigned char *key,
                           unsigned int keybits)
{
#if !defined(MBEDTLS_AES_USE_HARDWARE_ONLY)
    uint32_t *SK;
#endif
    int ret;
    mbedtls_aes_context cty;
    uint32_t *RK;


    mbedtls_aes_init(&cty);

    ctx->rk_offset = mbedtls_aes_rk_offset(ctx->buf);
    RK = ctx->buf + ctx->rk_offset;

    /* Also checks keybits */
    if ((ret = mbedtls_aes_setkey_enc(&cty, key, keybits)) != 0) {
        goto exit;
    }

    ctx->nr = cty.nr;

#if defined(MBEDTLS_AESNI_HAVE_CODE)
    if (mbedtls_aesni_has_support(MBEDTLS_AESNI_AES)) {
        mbedtls_aesni_inverse_key((unsigned char *) RK,
                                  (const unsigned char *) (cty.buf + cty.rk_offset), ctx->nr);
        goto exit;
    }
#endif

#if defined(MBEDTLS_AESCE_HAVE_CODE)
    if (MBEDTLS_AESCE_HAS_SUPPORT()) {
        mbedtls_aesce_inverse_key(
            (unsigned char *) RK,
            (const unsigned char *) (cty.buf + cty.rk_offset),
            ctx->nr);
        goto exit;
    }
#endif

#if !defined(MBEDTLS_AES_USE_HARDWARE_ONLY)
    SK = cty.buf + cty.rk_offset + cty.nr * 4;

    *RK++ = *SK++;
    *RK++ = *SK++;
    *RK++ = *SK++;
    *RK++ = *SK++;
    SK -= 8;
    for (int i = ctx->nr - 1; i > 0; i--, SK -= 8) {
        for (int j = 0; j < 4; j++, SK++) {
            *RK++ = AES_RT0(FSb[MBEDTLS_BYTE_0(*SK)]) ^
                    AES_RT1(FSb[MBEDTLS_BYTE_1(*SK)]) ^
                    AES_RT2(FSb[MBEDTLS_BYTE_2(*SK)]) ^
                    AES_RT3(FSb[MBEDTLS_BYTE_3(*SK)]);
        }
    }

    *RK++ = *SK++;
    *RK++ = *SK++;
    *RK++ = *SK++;
    *RK++ = *SK++;
#endif /* !MBEDTLS_AES_USE_HARDWARE_ONLY */
exit:
    mbedtls_aes_free(&cty);

    return ret;
}